

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

void nghttp2_bufs_seek_last_present(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *local_18;
  nghttp2_buf_chain *ci;
  nghttp2_bufs *bufs_local;
  
  for (local_18 = bufs->cur;
      (local_18 != (nghttp2_buf_chain *)0x0 && ((local_18->buf).last != (local_18->buf).pos));
      local_18 = local_18->next) {
    bufs->cur = local_18;
  }
  return;
}

Assistant:

void nghttp2_bufs_seek_last_present(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *ci;

  for (ci = bufs->cur; ci; ci = ci->next) {
    if (nghttp2_buf_len(&ci->buf) == 0) {
      return;
    } else {
      bufs->cur = ci;
    }
  }
}